

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void pnga_access_idx(Integer g_a,Integer *lo,Integer *hi,AccessIndex *index,Integer *ld)

{
  long lVar1;
  ushort uVar2;
  C_Integer *pCVar3;
  long *plVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  logical lVar8;
  size_t sVar9;
  Integer IVar10;
  long lVar11;
  C_Integer CVar12;
  SingleComplex **ppSVar13;
  ushort uVar14;
  long lVar15;
  undefined4 uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  global_array_t *pgVar20;
  DoubleComplex *pDVar21;
  long lVar22;
  Integer _d;
  long lVar23;
  char *pcVar24;
  Integer ow;
  long local_1f0;
  long *local_1e8;
  Integer local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long *local_1c0;
  Integer _hi [7];
  Integer _lo [7];
  char err_string [256];
  
  local_1f0 = g_a * 0x368;
  iVar7 = GA[g_a + 1000].p_handle;
  lVar23 = (long)iVar7;
  local_1e0 = g_a;
  lVar8 = pnga_locate(g_a,lo,&ow);
  if (lVar8 == 0) {
    pnga_error("locate top failed",0);
  }
  if (iVar7 != -1) {
    ow = (Integer)PGRP_LIST[lVar23].inv_map_proc_list[ow];
  }
  local_1c0 = ld;
  iVar5 = armci_domain_id(0,(int)ow);
  iVar6 = armci_domain_my_id(0);
  if ((iVar5 != iVar6) && (ow != CONCAT44(GAme._4_4_,(uint)GAme))) {
    pnga_error("cannot access top of the patch",ow);
  }
  lVar8 = pnga_locate(local_1e0,hi,&ow);
  if (lVar8 == 0) {
    pnga_error("locate bottom failed",0);
  }
  if (iVar7 != -1) {
    ow = (Integer)PGRP_LIST[lVar23].inv_map_proc_list[ow];
  }
  lVar1 = local_1e0 + 1000;
  local_1e8 = index;
  iVar7 = armci_domain_id(0,(int)ow);
  iVar5 = armci_domain_my_id(0);
  if ((iVar7 != iVar5) && (ow != CONCAT44(GAme._4_4_,(uint)GAme))) {
    pnga_error("cannot access bottom of the patch",ow);
  }
  local_1d8 = 0;
  pgVar20 = GA;
  local_1d0 = lVar1;
  local_1c8 = lVar23;
  while( true ) {
    uVar2 = pgVar20[lVar1].ndim;
    lVar23 = (long)(short)uVar2;
    if (lVar23 <= local_1d8) break;
    if (hi[local_1d8] < lo[local_1d8]) {
      builtin_strncpy(err_string,"cannot locate region: ",0x17);
      strcpy(err_string + 0x16,pgVar20[lVar1].name);
      sVar9 = strlen(err_string);
      sprintf(err_string + (int)sVar9," [%ld:%ld ",*lo,*hi);
      sVar9 = strlen(err_string);
      for (lVar23 = 1; pcVar24 = err_string + (int)sVar9, lVar23 < GA[lVar1].ndim;
          lVar23 = lVar23 + 1) {
        sprintf(pcVar24,",%ld:%ld ",lo[lVar23],hi[lVar23]);
        sVar9 = strlen(err_string);
      }
      pcVar24[0] = ']';
      pcVar24[1] = '\0';
      pnga_error(err_string,local_1e0);
      pgVar20 = GA;
    }
    local_1d8 = local_1d8 + 1;
  }
  if ((int)local_1c8 != -1) {
    ow = (Integer)PGRP_LIST[local_1c8].map_proc_list[ow];
  }
  iVar7 = pgVar20[lVar1].distr_type;
  if (iVar7 - 1U < 3) {
    lVar17 = (long)(int)ow % pgVar20[lVar1].num_blocks[0];
    uVar16 = (undefined4)lVar17;
    err_string[0] = (char)uVar16;
    err_string[1] = (char)((uint)uVar16 >> 8);
    err_string[2] = (char)((uint)uVar16 >> 0x10);
    err_string[3] = (char)((uint)uVar16 >> 0x18);
    IVar10 = ow;
    lVar11 = 0;
    while (lVar11 + 1 < lVar23) {
      IVar10 = (long)((int)IVar10 - (int)lVar17) /
               *(long *)((long)pgVar20[1000].num_blocks + lVar11 * 8 + local_1f0);
      lVar17 = (long)(int)IVar10 %
               *(long *)((long)pgVar20[1000].num_blocks + lVar11 * 8 + local_1f0 + 8);
      *(int *)(err_string + lVar11 * 4 + 4) = (int)lVar17;
      lVar11 = lVar11 + 1;
    }
    lVar11 = 0;
    uVar14 = 0;
    if (0 < (short)uVar2) {
      uVar14 = uVar2;
    }
    for (; (ulong)uVar14 * 4 != lVar11; lVar11 = lVar11 + 4) {
      iVar7 = *(int *)(err_string + lVar11);
      lVar17 = *(long *)((long)pgVar20[1000].block_dims + lVar11 * 2 + local_1f0);
      *(long *)((long)_lo + lVar11 * 2) = lVar17 * iVar7 + 1;
      lVar17 = ((long)iVar7 + 1) * lVar17;
      *(long *)((long)_hi + lVar11 * 2) = lVar17;
      lVar15 = *(long *)((long)pgVar20[1000].dims + lVar11 * 2 + local_1f0);
      if (lVar15 <= lVar17) {
        lVar17 = lVar15;
      }
      *(long *)((long)_hi + lVar11 * 2) = lVar17;
    }
  }
  else if (iVar7 == 4) {
    lVar17 = (long)(int)ow % pgVar20[lVar1].num_blocks[0];
    uVar16 = (undefined4)lVar17;
    err_string[0] = (char)uVar16;
    err_string[1] = (char)((uint)uVar16 >> 8);
    err_string[2] = (char)((uint)uVar16 >> 0x10);
    err_string[3] = (char)((uint)uVar16 >> 0x18);
    IVar10 = ow;
    lVar11 = 0;
    while (lVar11 + 1 < lVar23) {
      IVar10 = (long)((int)IVar10 - (int)lVar17) /
               *(long *)((long)pgVar20[1000].num_blocks + lVar11 * 8 + local_1f0);
      lVar17 = (long)(int)IVar10 %
               *(long *)((long)pgVar20[1000].num_blocks + lVar11 * 8 + local_1f0 + 8);
      *(int *)(err_string + lVar11 * 4 + 4) = (int)lVar17;
      lVar11 = lVar11 + 1;
    }
    lVar11 = 0;
    uVar14 = 0;
    if (0 < (short)uVar2) {
      uVar14 = uVar2;
    }
    iVar7 = 0;
    for (; (ulong)uVar14 * 4 != lVar11; lVar11 = lVar11 + 4) {
      pCVar3 = pgVar20[lVar1].mapc;
      iVar5 = *(int *)(err_string + lVar11);
      lVar17 = (long)iVar7 + (long)iVar5;
      *(C_Integer *)((long)_lo + lVar11 * 2) = pCVar3[lVar17];
      if ((long)iVar5 < *(long *)((long)pgVar20[lVar1].num_blocks + lVar11 * 2) + -1) {
        lVar17 = pCVar3[lVar17 + 1] + -1;
      }
      else {
        lVar17 = *(long *)((long)pgVar20[lVar1].dims + lVar11 * 2);
      }
      *(long *)((long)_hi + lVar11 * 2) = lVar17;
      iVar7 = iVar7 + *(int *)((long)pgVar20[lVar1].num_blocks + lVar11 * 2);
    }
  }
  else if (iVar7 == 0) {
    if (pgVar20[lVar1].num_rstrctd == 0) {
      lVar17 = 0;
      lVar11 = 0;
      if (0 < lVar23) {
        lVar11 = lVar23;
      }
      lVar15 = 1;
      for (; lVar11 != lVar17; lVar17 = lVar17 + 1) {
        lVar15 = lVar15 * *(int *)((long)pgVar20[1000].nblock + lVar17 * 4 + local_1f0);
      }
      if (ow < lVar15 && -1 < ow) {
        lVar15 = 0;
        IVar10 = ow;
        for (lVar17 = 0; lVar11 != lVar17; lVar17 = lVar17 + 1) {
          lVar22 = (long)*(int *)((long)pgVar20[1000].nblock + lVar17 * 4 + local_1f0);
          lVar18 = IVar10 % lVar22;
          pCVar3 = pgVar20[lVar1].mapc;
          _lo[lVar17] = pCVar3[lVar18 + lVar15];
          if (lVar18 == lVar22 + -1) {
            lVar18 = *(long *)((long)pgVar20[1000].dims + lVar17 * 8 + local_1f0);
          }
          else {
            lVar18 = pCVar3[lVar18 + lVar15 + 1] + -1;
          }
          lVar15 = lVar15 + lVar22;
          _hi[lVar17] = lVar18;
          IVar10 = IVar10 / lVar22;
        }
      }
      else {
        for (lVar17 = 0; lVar11 != lVar17; lVar17 = lVar17 + 1) {
          _lo[lVar17] = 0;
          _hi[lVar17] = -1;
        }
      }
    }
    else if (ow < pgVar20[lVar1].num_rstrctd) {
      lVar17 = 0;
      lVar11 = 0;
      if (0 < lVar23) {
        lVar11 = lVar23;
      }
      lVar15 = 1;
      for (; lVar11 != lVar17; lVar17 = lVar17 + 1) {
        lVar15 = lVar15 * *(int *)((long)pgVar20[1000].nblock + lVar17 * 4 + local_1f0);
      }
      if ((ow < 0) || (lVar15 <= ow)) {
        for (lVar17 = 0; lVar11 != lVar17; lVar17 = lVar17 + 1) {
          _lo[lVar17] = 0;
          _hi[lVar17] = -1;
        }
      }
      else {
        lVar15 = 0;
        IVar10 = ow;
        for (lVar17 = 0; lVar11 != lVar17; lVar17 = lVar17 + 1) {
          lVar22 = (long)*(int *)((long)pgVar20[1000].nblock + lVar17 * 4 + local_1f0);
          lVar18 = IVar10 % lVar22;
          pCVar3 = pgVar20[lVar1].mapc;
          _lo[lVar17] = pCVar3[lVar18 + lVar15];
          if (lVar18 == lVar22 + -1) {
            lVar18 = *(long *)((long)pgVar20[1000].dims + lVar17 * 8 + local_1f0);
          }
          else {
            lVar18 = pCVar3[lVar18 + lVar15 + 1] + -1;
          }
          lVar15 = lVar15 + lVar22;
          _hi[lVar17] = lVar18;
          IVar10 = IVar10 / lVar22;
        }
      }
    }
    else {
      lVar11 = 0;
      iVar7 = 0;
      if (0 < (short)uVar2) {
        iVar7 = (int)(short)uVar2;
      }
      for (; iVar7 != lVar11; lVar11 = lVar11 + 1) {
        _lo[lVar11] = 0;
        _hi[lVar11] = -1;
      }
    }
  }
  lVar11 = lVar23 + -1;
  local_1d8 = lVar23;
  for (lVar17 = 0; lVar17 < pgVar20[lVar1].ndim; lVar17 = lVar17 + 1) {
    if (_hi[lVar17] < lo[lVar17] || lo[lVar17] < _lo[lVar17]) {
      sprintf(err_string,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
      pnga_error(err_string,lVar17);
      pgVar20 = GA;
    }
  }
  if (lVar11 == 0) {
    *local_1c0 = (_hi[0] - _lo[0]) + pgVar20[lVar1].width[0] * 2 + 1;
  }
  lVar23 = 0;
  if (lVar11 < 1) {
    lVar11 = lVar23;
  }
  lVar17 = 1;
  lVar15 = 0;
  for (; lVar11 != lVar23; lVar23 = lVar23 + 1) {
    lVar18 = *(long *)((long)pgVar20[1000].width + lVar23 * 8 + local_1f0);
    lVar22 = ((lVar18 * 2 + 1) - _lo[lVar23]) + _hi[lVar23];
    lVar15 = lVar15 + ((lVar18 + lo[lVar23]) - _lo[lVar23]) * lVar17;
    local_1c0[lVar23] = lVar22;
    lVar17 = lVar17 * lVar22;
  }
  if (pgVar20[lVar1].p_handle == 0) {
    CVar12 = (long)PGRP_LIST->inv_map_proc_list[ow];
  }
  else {
    CVar12 = ow;
    if (pgVar20[lVar1].num_rstrctd != 0) {
      CVar12 = pgVar20[lVar1].rstrctd_list[ow];
    }
  }
  uVar19 = (ulong)pgVar20[lVar1].elemsize;
  pcVar24 = pgVar20[lVar1].ptr[CVar12] +
            (((lo[local_1d8 + -1] - _lo[local_1d8 + -1]) + pgVar20[lVar1].width[local_1d8 + -1]) *
             lVar17 + lVar15) * uVar19;
  IVar10 = pnga_type_c2f((long)pgVar20[lVar1].type);
  plVar4 = local_1e8;
  switch(IVar10) {
  case 0x3f2:
    ppSVar13 = (SingleComplex **)&INT_MB;
    break;
  default:
    pDVar21 = (DoubleComplex *)0x0;
    goto LAB_001ca359;
  case 0x3f4:
    lVar23 = (long)pcVar24 - (long)FLT_MB >> 2;
    pDVar21 = (DoubleComplex *)FLT_MB;
    goto LAB_001ca351;
  case 0x3f5:
    ppSVar13 = (SingleComplex **)&DBL_MB;
    break;
  case 0x3f6:
    ppSVar13 = &SCPL_MB;
    break;
  case 0x3f7:
    lVar23 = (long)pcVar24 - (long)DCPL_MB >> 4;
    pDVar21 = DCPL_MB;
    goto LAB_001ca351;
  }
  pDVar21 = (DoubleComplex *)*ppSVar13;
  lVar23 = (long)pcVar24 - (long)pDVar21 >> 3;
LAB_001ca351:
  *local_1e8 = lVar23;
LAB_001ca359:
  if ((ulong)pcVar24 % uVar19 != (ulong)pDVar21 % uVar19) {
    printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(ulong)(uint)GAme,pcVar24,(ulong)pcVar24 % uVar19,
           pDVar21,(ulong)pDVar21 % uVar19);
    pnga_error("nga_access: MA addressing problem: base address misallignment",local_1d0);
  }
  *plVar4 = *plVar4 + 1;
  return;
}

Assistant:

void pnga_access_idx(Integer g_a, Integer lo[], Integer hi[],
                     AccessIndex* index, Integer ld[])
{
char     *ptr;
Integer  handle = GA_OFFSET + g_a;
Integer  ow,i,p_handle;
unsigned long    elemsize;
unsigned long    lref=0, lptr;

   
   p_handle = GA[handle].p_handle;
   if(!pnga_locate(g_a,lo,&ow))pnga_error("locate top failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme)) 
      pnga_error("cannot access top of the patch",ow);
   if(!pnga_locate(g_a,hi, &ow))pnga_error("locate bottom failed",0);
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].inv_map_proc_list[ow];
   if ((armci_domain_id(ARMCI_DOMAIN_SMP, ow) != armci_domain_my_id(ARMCI_DOMAIN_SMP)) && (ow != GAme)) 
      pnga_error("cannot access bottom of the patch",ow);

   for (i=0; i<GA[handle].ndim; i++)
       if(lo[i]>hi[i]) {
           ga_RegionError(GA[handle].ndim, lo, hi, g_a);
       }

   
   if (p_handle != -1)
      ow = PGRP_LIST[p_handle].map_proc_list[ow];

   gam_Location(ow,handle, lo, &ptr, ld);

   /*
    * return patch address as the distance elements from the reference address
    *
    * .in Fortran we need only the index to the type array: dbl_mb or int_mb
    *  that are elements of COMMON in the the mafdecls.h include file
    * .in C we need both the index and the pointer
    */

   elemsize = (unsigned long)GA[handle].elemsize;

   /* compute index and check if it is correct */
   switch (pnga_type_c2f(GA[handle].type)){
     case MT_F_DBL:
        *index = (AccessIndex) ((DoublePrecision*)ptr - DBL_MB);
        lref = (unsigned long)DBL_MB;
        break;

     case MT_F_DCPL:
        *index = (AccessIndex) ((DoubleComplex*)ptr - DCPL_MB);
        lref = (unsigned long)DCPL_MB;
        break;

     case MT_F_SCPL:
        *index = (AccessIndex) ((SingleComplex*)ptr - SCPL_MB);
        lref = (unsigned long)SCPL_MB;
        break;

     case MT_F_INT:
        *index = (AccessIndex) ((Integer*)ptr - INT_MB);
        lref = (unsigned long)INT_MB;
        break;

     case MT_F_REAL:
        *index = (AccessIndex) ((float*)ptr - FLT_MB);
        lref = (unsigned long)FLT_MB;
        break;        
   }

   /* check the allignment */
   lptr = (unsigned long)ptr;
   if( lptr%elemsize != lref%elemsize ){ 
       printf("%d: lptr=%lu(%lu) lref=%lu(%lu)\n",(int)GAme,lptr,lptr%elemsize,
                                                    lref,lref%elemsize);
       pnga_error("nga_access: MA addressing problem: base address misallignment",
                 handle);
   }

   /* adjust index for Fortran addressing */
   (*index) ++ ;
   FLUSH_CACHE;

}